

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeAtomicCmpxchg
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Type type,int bytes,Name *mem,Memarg memarg)

{
  __index_type *__return_storage_ptr___00;
  Name *pNVar1;
  bool bVar2;
  Address local_f8;
  Result<wasm::Ok> local_f0;
  uint local_c4;
  Err local_c0;
  Err *local_a0;
  Err *err;
  undefined1 local_88 [8];
  Result<wasm::Name> _val;
  Result<wasm::Name> m;
  int bytes_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *this_local;
  Type type_local;
  
  __return_storage_ptr___00 =
       &_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_index;
  getMemory((Result<wasm::Name> *)__return_storage_ptr___00,this,pos,mem);
  Result<wasm::Name>::Result
            ((Result<wasm::Name> *)local_88,(Result<wasm::Name> *)__return_storage_ptr___00);
  local_a0 = Result<wasm::Name>::getErr((Result<wasm::Name> *)local_88);
  bVar2 = local_a0 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_c0,local_a0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c0);
    wasm::Err::~Err(&local_c0);
  }
  local_c4 = (uint)bVar2;
  Result<wasm::Name>::~Result((Result<wasm::Name> *)local_88);
  if (local_c4 == 0) {
    wasm::Address::Address(&local_f8,memarg.offset);
    pNVar1 = Result<wasm::Name>::operator*
                       ((Result<wasm::Name> *)
                        &_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_index);
    IRBuilder::makeAtomicCmpxchg
              (&local_f0,&this->irBuilder,bytes,local_f8,type,(Name)(pNVar1->super_IString).str);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,&local_f0);
    Result<wasm::Ok>::~Result(&local_f0);
    local_c4 = 1;
  }
  Result<wasm::Name>::~Result
            ((Result<wasm::Name> *)
             &_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
              super__Move_assign_alias<wasm::Name,_wasm::Err>.
              super__Copy_assign_alias<wasm::Name,_wasm::Err>.
              super__Move_ctor_alias<wasm::Name,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
              super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_index);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeAtomicCmpxchg(Index pos,
                             const std::vector<Annotation>& annotations,
                             Type type,
                             int bytes,
                             Name* mem,
                             Memarg memarg) {
    auto m = getMemory(pos, mem);
    CHECK_ERR(m);
    return withLoc(pos,
                   irBuilder.makeAtomicCmpxchg(bytes, memarg.offset, type, *m));
  }